

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

ggml_status ggml_graph_compute(ggml_cgraph *cgraph,ggml_cplan *cplan)

{
  int iVar1;
  ggml_status gVar2;
  ggml_cplan *in_RSI;
  ggml_cgraph *in_RDI;
  ggml_status ret;
  ggml_threadpool_params ttp;
  _Bool disposable_threadpool;
  ggml_threadpool *threadpool;
  int n_threads;
  int in_stack_fffffffffffffdcc;
  ggml_threadpool *in_stack_fffffffffffffdd0;
  ggml_threadpool *in_stack_fffffffffffffde0;
  ggml_cplan *in_stack_fffffffffffffdf0;
  ggml_cgraph *in_stack_fffffffffffffdf8;
  ggml_threadpool_params *in_stack_fffffffffffffe00;
  void *in_stack_fffffffffffffe20;
  bool local_21;
  ggml_threadpool *local_20;
  
  ggml_cpu_init();
  if (in_RSI == (ggml_cplan *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
               ,0xc16,"GGML_ASSERT(%s) failed","cplan");
  }
  if (in_RSI->n_threads < 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
               ,0xc17,"GGML_ASSERT(%s) failed","cplan->n_threads > 0");
  }
  if ((in_RSI->work_size != 0) && (in_RSI->work_data == (uint8_t *)0x0)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
               ,0xc18,"GGML_ASSERT(%s) failed","cplan->work_size == 0 || cplan->work_data != NULL");
  }
  iVar1 = in_RSI->n_threads;
  local_20 = in_RSI->threadpool;
  local_21 = local_20 != (ggml_threadpool *)0x0;
  if (local_21) {
    local_20->cgraph = in_RDI;
    local_20->cplan = in_RSI;
    LOCK();
    local_20->current_chunk = 0;
    UNLOCK();
    LOCK();
    local_20->abort = -1;
    UNLOCK();
    local_20->ec = GGML_STATUS_SUCCESS;
  }
  else {
    ggml_threadpool_params_default(&stack0xfffffffffffffdcc,iVar1);
    local_20 = ggml_threadpool_new_impl
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                          in_stack_fffffffffffffdf0);
  }
  local_21 = !local_21;
  if (local_20->n_threads_max < iVar1) {
    ggml_log_internal(3,"cplan requested more threads (%d) than available (%d)\n",iVar1,
                      local_20->n_threads_max);
  }
  ggml_graph_compute_kickoff(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  ggml_graph_compute_thread(in_stack_fffffffffffffe20);
  clear_numa_thread_affinity();
  gVar2 = local_20->ec;
  if (local_21) {
    ggml_threadpool_free(in_stack_fffffffffffffde0);
  }
  return gVar2;
}

Assistant:

enum ggml_status ggml_graph_compute(struct ggml_cgraph * cgraph, struct ggml_cplan * cplan) {
    ggml_cpu_init();

    GGML_ASSERT(cplan);
    GGML_ASSERT(cplan->n_threads > 0);
    GGML_ASSERT(cplan->work_size == 0 || cplan->work_data != NULL);

    int n_threads                               = cplan->n_threads;
    struct ggml_threadpool * threadpool = cplan->threadpool;

    bool disposable_threadpool = false;

    if (threadpool == NULL) {
        //GGML_PRINT_DEBUG("Threadpool is not specified. Will create a disposable threadpool : n_threads %d\n", n_threads);
        disposable_threadpool = true;

        struct ggml_threadpool_params ttp = ggml_threadpool_params_default(n_threads);
        threadpool = ggml_threadpool_new_impl(&ttp, cgraph, cplan);
    } else {
        // Reset some of the parameters that need resetting
        // No worker threads should be accessing the parameters below at this stage
        threadpool->cgraph           = cgraph;
        threadpool->cplan            = cplan;
        threadpool->current_chunk    = 0;
        threadpool->abort            = -1;
        threadpool->ec               = GGML_STATUS_SUCCESS;
    }

#ifdef GGML_USE_OPENMP
    if (n_threads > 1) {
        #pragma omp parallel num_threads(n_threads)
        {
            #pragma omp single
            {
                // update the number of threads from the actual number of threads that we got from OpenMP
                n_threads = omp_get_num_threads();
                atomic_store_explicit(&threadpool->n_threads_cur, n_threads, memory_order_relaxed);
            }

            ggml_graph_compute_thread(&threadpool->workers[omp_get_thread_num()]);
        }
    } else {
        atomic_store_explicit(&threadpool->n_threads_cur, 1, memory_order_relaxed);
        ggml_graph_compute_thread(&threadpool->workers[0]);
    }
#else
    if (n_threads > threadpool->n_threads_max) {
        GGML_LOG_WARN("cplan requested more threads (%d) than available (%d)\n", n_threads, threadpool->n_threads_max);
        n_threads = threadpool->n_threads_max;
    }

    // Kick all threads to start the new graph
    ggml_graph_compute_kickoff(threadpool, n_threads);

    // This is a work thread too
    ggml_graph_compute_thread(&threadpool->workers[0]);
#endif

    // don't leave affinity set on the main thread
    clear_numa_thread_affinity();

    enum ggml_status ret = threadpool->ec;

    if (disposable_threadpool) {
        ggml_threadpool_free(threadpool);
    }

    return ret;
}